

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usetiter.cpp
# Opt level: O0

UnicodeString * __thiscall icu_63::UnicodeSetIterator::getString(UnicodeSetIterator *this)

{
  UnicodeString *this_00;
  size_t in_RSI;
  UnicodeString *local_40;
  UnicodeSetIterator *this_local;
  
  if ((this->string == (UnicodeString *)0x0) && (this->codepoint != -1)) {
    if (this->cpString == (UnicodeString *)0x0) {
      this_00 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,in_RSI);
      local_40 = (UnicodeString *)0x0;
      if (this_00 != (UnicodeString *)0x0) {
        UnicodeString::UnicodeString(this_00);
        local_40 = this_00;
      }
      this->cpString = local_40;
    }
    if (this->cpString != (UnicodeString *)0x0) {
      UnicodeString::setTo(this->cpString,this->codepoint);
    }
    this->string = this->cpString;
  }
  return this->string;
}

Assistant:

const UnicodeString& UnicodeSetIterator::getString()  {
    if (string==NULL && codepoint!=(UChar32)IS_STRING) {
       if (cpString == NULL) {
          cpString = new UnicodeString();
       }
       if (cpString != NULL) {
          cpString->setTo((UChar32)codepoint);
       }
       string = cpString;
    }
    return *string;
}